

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

void POLYEV(int NN,double *SR,double *SI,double *PR,double *PI,double *QR,double *QI,double *PVR,
           double *PVI)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_44;
  int i;
  double T;
  double *QR_local;
  double *PI_local;
  double *PR_local;
  double *SI_local;
  double *SR_local;
  int NN_local;
  
  *QR = *PR;
  *QI = *PI;
  *PVR = *QR;
  *PVI = *QI;
  for (local_44 = 1; local_44 < NN; local_44 = local_44 + 1) {
    dVar1 = *PVR;
    dVar2 = *SR;
    dVar3 = *PVI;
    dVar4 = *SI;
    dVar5 = PR[local_44];
    *PVI = *PVR * *SI + *PVI * *SR + PI[local_44];
    *PVR = dVar1 * dVar2 + -(dVar3 * dVar4) + dVar5;
    QR[local_44] = *PVR;
    QI[local_44] = *PVI;
  }
  return;
}

Assistant:

static void POLYEV(int NN, double *SR, double *SI,double *PR, double *PI, double *QR, double *QI, double *PVR, double *PVI) {
	double T;
	int i;
	QR[0] = PR[0];
	QI[0] = PI[0];
	*PVR = QR[0];
	*PVI = QI[0];

	for (i = 1; i < NN; ++i) {
		T = *PVR * *SR - *PVI * *SI + PR[i];
		*PVI = *PVR * *SI + *PVI * *SR + PI[i];
		*PVR = T;
		QR[i] = *PVR;
		QI[i] = *PVI;
	}
}